

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient4dadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,
                    double bheight,double cheight,double dheight,double eheight,double permanent)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int elen;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar25;
  double dVar26;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar21 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  double dVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar44;
  double dVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double temp16 [16];
  double temp8c [8];
  double temp8a [8];
  double temp24 [24];
  double temp8b [8];
  double cdet [48];
  double bdet [48];
  double adet [48];
  double ddet [48];
  double fin1 [192];
  double cddet [96];
  double abdet [96];
  undefined4 uStack_17a4;
  undefined4 uStack_17a0;
  undefined4 uStack_179c;
  double dStack_1780;
  undefined4 uStack_1754;
  double dStack_1750;
  undefined4 uStack_1744;
  undefined4 uStack_1740;
  undefined4 uStack_173c;
  double dStack_1730;
  double dStack_1680;
  double local_14f8;
  double dStack_14f0;
  double local_14e8;
  double dStack_14e0;
  double local_14d8;
  double dStack_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  double dStack_14b0;
  undefined1 local_14a8 [16];
  double local_1498;
  double dStack_1490;
  undefined1 local_1488 [16];
  double local_1478;
  double dStack_1470;
  double local_1468;
  double dStack_1460;
  double local_1458;
  double dStack_1450;
  double local_1448;
  double local_1440;
  double local_1438 [16];
  double local_13b8 [8];
  double local_1378 [8];
  double local_1338 [24];
  double local_1278 [8];
  double local_1238 [48];
  double local_10b8 [48];
  double local_f38 [48];
  double local_db8 [48];
  double local_c38 [192];
  double local_638 [96];
  double local_338 [97];
  
  dVar62 = *pe;
  dVar61 = pe[1];
  dVar46 = *pa;
  dVar48 = pa[1];
  dVar29 = dVar46 - dVar62;
  dVar35 = dVar48 - dVar61;
  dVar52 = *pb;
  dVar55 = pb[1];
  dVar17 = dVar52 - dVar62;
  dVar25 = dVar55 - dVar61;
  dVar1 = dVar25 * splitter - (dVar25 * splitter - dVar25);
  dVar69 = dVar17 * splitter - (dVar17 * splitter - dVar17);
  dVar36 = dVar29 * splitter - (dVar29 * splitter - dVar29);
  dVar44 = dVar35 * splitter - (dVar35 * splitter - dVar35);
  dVar64 = dVar25 * dVar29;
  dVar68 = dVar17 * dVar35;
  dVar49 = dVar29 - dVar36;
  dVar53 = dVar35 - dVar44;
  dVar63 = dVar25 - dVar1;
  dVar65 = dVar17 - dVar69;
  auVar2._8_4_ = SUB84(dVar65,0);
  auVar2._0_8_ = dVar49;
  auVar2._12_4_ = (int)((ulong)dVar65 >> 0x20);
  dVar18 = dVar63 * dVar49 - (((dVar64 - dVar36 * dVar1) - dVar49 * dVar1) - dVar63 * dVar36);
  dVar26 = dVar65 * dVar53 - (((dVar68 - dVar69 * dVar44) - dVar65 * dVar44) - dVar53 * dVar69);
  dVar50 = dVar18 - dVar26;
  dVar4 = dVar64 + dVar50;
  dVar37 = (dVar64 - (dVar4 - (dVar4 - dVar64))) + (dVar50 - (dVar4 - dVar64));
  dVar38 = dVar37 - dVar68;
  dVar64 = pa[2];
  dVar66 = pb[2];
  local_14b8 = (dVar18 - (dVar50 + (dVar18 - dVar50))) + ((dVar18 - dVar50) - dVar26);
  dStack_14b0 = (dVar37 - (dVar38 + (dVar37 - dVar38))) + ((dVar37 - dVar38) - dVar68);
  dVar68 = pc[2];
  dVar18 = pd[2];
  dVar73 = *pc;
  dVar75 = pc[1];
  dVar78 = *pd;
  dVar19 = pd[1];
  dVar26 = pe[2];
  dVar30 = dVar4 + dVar38;
  local_14a8._8_4_ = SUB84(dVar30,0);
  local_14a8._0_8_ = (dVar4 - (dVar30 - (dVar30 - dVar4))) + (dVar38 - (dVar30 - dVar4));
  local_14a8._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dVar57 = dVar73 - dVar62;
  dVar60 = dVar75 - dVar61;
  dVar70 = dVar57 * splitter - (dVar57 * splitter - dVar57);
  dVar71 = dVar60 * splitter - (dVar60 * splitter - dVar60);
  dVar51 = dVar19 - dVar61;
  dVar54 = dVar78 - dVar62;
  dVar50 = splitter * dVar51 - (splitter * dVar51 - dVar51);
  dVar5 = splitter * dVar54 - (splitter * dVar54 - dVar54);
  dVar36 = -dVar36;
  dVar69 = -dVar69;
  dVar39 = -dVar70;
  dVar45 = -dVar5;
  dVar72 = dVar57 - dVar70;
  dVar74 = dVar60 - dVar71;
  dVar76 = dVar51 - dVar50;
  dVar77 = dVar54 - dVar5;
  dStack_1780 = auVar2._8_8_;
  dVar4 = dVar57 * dVar25;
  dVar37 = dVar60 * dVar17;
  dVar38 = dVar63 * dVar72 - (dVar39 * dVar63 + -dVar72 * dVar1 + dVar39 * dVar1 + dVar4);
  dVar47 = dVar65 * dVar74 - (dVar74 * dVar69 + dVar71 * -dStack_1780 + dVar71 * dVar69 + dVar37);
  dVar58 = dVar47 - dVar38;
  dVar67 = dVar37 + dVar58;
  dVar37 = (dVar37 - (dVar67 - (dVar67 - dVar37))) + (dVar58 - (dVar67 - dVar37));
  dVar56 = dVar37 - dVar4;
  local_1458 = (dVar47 - (dVar58 + (dVar47 - dVar58))) + ((dVar47 - dVar58) - dVar38);
  dStack_1450 = (dVar37 - ((dVar37 - dVar56) + dVar56)) + ((dVar37 - dVar56) - dVar4);
  dVar4 = dVar67 + dVar56;
  local_1448 = (dVar67 - (dVar4 - (dVar4 - dVar67))) + (dVar56 - (dVar4 - dVar67));
  dVar37 = dVar51 * dVar57;
  dVar38 = dVar54 * dVar60;
  dVar56 = dVar72 * dVar76 - (((dVar37 - dVar70 * dVar50) - dVar50 * dVar72) - dVar76 * dVar70);
  dVar58 = dVar74 * dVar77 - (((dVar38 - dVar5 * dVar71) - dVar71 * dVar77) - dVar74 * dVar5);
  dVar5 = dVar56 - dVar58;
  dVar47 = dVar37 + dVar5;
  dVar37 = (dVar37 - (dVar47 - (dVar47 - dVar37))) + (dVar5 - (dVar47 - dVar37));
  dVar67 = dVar37 - dVar38;
  local_1478 = (dVar56 - (dVar5 + (dVar56 - dVar5))) + ((dVar56 - dVar5) - dVar58);
  dStack_1470 = (dVar37 - (dVar67 + (dVar37 - dVar67))) + ((dVar37 - dVar67) - dVar38);
  dVar5 = dVar47 + dVar67;
  local_1468 = (dVar47 - (dVar5 - (dVar5 - dVar47))) + (dVar67 - (dVar5 - dVar47));
  dVar47 = dVar29 * dVar51;
  dVar56 = dVar35 * dVar54;
  dVar37 = dVar49 * dVar76 - (dVar76 * dVar36 + -dVar49 * dVar50 + dVar36 * dVar50 + dVar47);
  dVar38 = dVar53 * dVar77 - (dVar53 * dVar45 + -dVar77 * dVar44 + dVar45 * dVar44 + dVar56);
  dVar58 = dVar38 - dVar37;
  dVar70 = dVar56 + dVar58;
  dVar56 = (dVar56 - (dVar70 - (dVar70 - dVar56))) + (dVar58 - (dVar70 - dVar56));
  dVar67 = dVar56 - dVar47;
  local_14d8 = (dVar38 - (dVar58 + (dVar38 - dVar58))) + ((dVar38 - dVar58) - dVar37);
  dStack_14d0 = (dVar56 - ((dVar56 - dVar67) + dVar67)) + ((dVar56 - dVar67) - dVar47);
  dVar59 = dVar70 + dVar67;
  local_14c8 = (dVar70 - (dVar59 - (dVar59 - dVar70))) + (dVar67 - (dVar59 - dVar70));
  dVar58 = dVar60 * dVar29;
  dVar67 = dVar57 * dVar35;
  dVar37 = dVar74 * dVar49 - (dVar74 * dVar36 + -dVar49 * dVar71 + dVar36 * dVar71 + dVar58);
  dVar38 = dVar72 * dVar53 - (dVar53 * dVar39 + -dVar72 * dVar44 + dVar39 * dVar44 + dVar67);
  dVar47 = dVar37 - dVar38;
  dVar56 = dVar58 + dVar47;
  dVar58 = (dVar58 - (dVar56 - (dVar56 - dVar58))) + (dVar47 - (dVar56 - dVar58));
  dVar36 = dVar58 - dVar67;
  local_14f8 = (dVar37 - (dVar47 + (dVar37 - dVar47))) + ((dVar37 - dVar47) - dVar38);
  dStack_14f0 = (dVar58 - (dVar36 + (dVar58 - dVar36))) + ((dVar58 - dVar36) - dVar67);
  dVar37 = dVar56 + dVar36;
  local_14e8 = (dVar56 - (dVar37 - (dVar37 - dVar56))) + (dVar36 - (dVar37 - dVar56));
  dVar38 = dVar51 * dVar17;
  dVar47 = dVar54 * dVar25;
  dVar56 = dVar65 * dVar76 - (dVar76 * dVar69 + -dStack_1780 * dVar50 + dVar69 * dVar50 + dVar38);
  dVar58 = dVar63 * dVar77 - (dVar63 * dVar45 + -dVar77 * dVar1 + dVar45 * dVar1 + dVar47);
  dVar69 = dVar56 - dVar58;
  dVar1 = dVar38 + dVar69;
  dVar38 = (dVar38 - (dVar1 - (dVar1 - dVar38))) + (dVar69 - (dVar1 - dVar38));
  dVar50 = dVar38 - dVar47;
  local_1498 = (dVar56 - (dVar69 + (dVar56 - dVar69))) + ((dVar56 - dVar69) - dVar58);
  dStack_1490 = (dVar38 - (dVar50 + (dVar38 - dVar50))) + ((dVar38 - dVar50) - dVar47);
  dVar44 = dVar1 + dVar50;
  local_1488._8_4_ = SUB84(dVar44,0);
  local_1488._0_8_ = (dVar1 - (dVar44 - (dVar44 - dVar1))) + (dVar50 - (dVar44 - dVar1));
  local_1488._12_4_ = (int)((ulong)dVar44 >> 0x20);
  dVar69 = dVar68 - dVar26;
  dVar58 = dVar18 - dVar26;
  auVar32._8_4_ = SUB84(dVar26,0);
  auVar32._0_8_ = dVar26;
  auVar32._12_4_ = (int)((ulong)dVar26 >> 0x20);
  dVar38 = dVar64 - dVar26;
  dVar67 = dVar66 - dVar26;
  auVar42._8_4_ = SUB84(dheight,0);
  auVar42._0_8_ = cheight;
  auVar42._12_4_ = (int)((ulong)dheight >> 0x20);
  dVar1 = cheight - eheight;
  uVar27 = SUB84(dheight - eheight,0);
  uVar28 = (undefined4)((ulong)(dheight - eheight) >> 0x20);
  auVar43._8_4_ = uVar27;
  auVar43._0_8_ = dVar1;
  auVar43._12_4_ = uVar28;
  dVar50 = aheight - eheight;
  dVar36 = bheight - eheight;
  dStack_14e0 = dVar37;
  local_14c0 = dVar59;
  dStack_1460 = dVar5;
  local_1440 = dVar4;
  iVar9 = scale_expansion_zeroelim(4,&local_1478,dVar67,local_1378);
  uStack_17a4 = (undefined4)((ulong)dVar69 >> 0x20);
  uStack_17a0 = SUB84(dVar58,0);
  uStack_179c = (undefined4)((ulong)dVar58 >> 0x20);
  dVar47 = -dVar69;
  iVar10 = scale_expansion_zeroelim(4,&local_1498,dVar47,local_1278);
  auVar6._4_8_ = extraout_XMM0_Qb;
  auVar6._0_4_ = uStack_17a4;
  auVar20._0_8_ = auVar6._0_8_ << 0x20;
  auVar20._8_4_ = uStack_17a0;
  auVar20._12_4_ = uStack_179c;
  dVar39 = auVar20._8_8_;
  iVar11 = scale_expansion_zeroelim(4,&local_1458,dVar39,local_13b8);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,local_1378,iVar10,local_1278,local_1438);
  iVar9 = fast_expansion_sum_zeroelim(iVar11,local_13b8,iVar9,local_1438,local_1338);
  uStack_1744 = (undefined4)((ulong)dVar50 >> 0x20);
  iVar9 = scale_expansion_zeroelim(iVar9,local_1338,-dVar50,local_f38);
  iVar10 = scale_expansion_zeroelim(4,&local_14d8,dVar69,local_1378);
  iVar11 = scale_expansion_zeroelim(4,&local_14f8,dVar39,local_1278);
  iVar12 = scale_expansion_zeroelim(4,&local_1478,dVar38,local_13b8);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,local_1378,iVar11,local_1278,local_1438);
  iVar10 = fast_expansion_sum_zeroelim(iVar12,local_13b8,iVar10,local_1438,local_1338);
  uStack_1740 = SUB84(dVar36,0);
  uStack_173c = (undefined4)((ulong)dVar36 >> 0x20);
  auVar7._4_8_ = extraout_XMM0_Qb_00;
  auVar7._0_4_ = uStack_1744;
  auVar21._0_8_ = auVar7._0_8_ << 0x20;
  auVar21._8_4_ = uStack_1740;
  auVar21._12_4_ = uStack_173c;
  iVar10 = scale_expansion_zeroelim(iVar10,local_1338,auVar21._8_8_,local_10b8);
  iVar11 = scale_expansion_zeroelim(4,&local_14b8,dVar39,local_1378);
  iVar12 = scale_expansion_zeroelim(4,&local_1498,dVar38,local_1278);
  iVar13 = scale_expansion_zeroelim(4,&local_14d8,dVar67,local_13b8);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,local_1378,iVar12,local_1278,local_1438);
  iVar11 = fast_expansion_sum_zeroelim(iVar13,local_13b8,iVar11,local_1438,local_1338);
  uStack_1754 = (undefined4)((ulong)dVar1 >> 0x20);
  iVar11 = scale_expansion_zeroelim(iVar11,local_1338,-dVar1,local_1238);
  iVar12 = scale_expansion_zeroelim(4,&local_1458,dVar38,local_1378);
  dVar56 = -dVar67;
  iVar13 = scale_expansion_zeroelim(4,&local_14f8,dVar56,local_1278);
  elen = scale_expansion_zeroelim(4,&local_14b8,dVar69,local_13b8);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,local_1378,iVar13,local_1278,local_1438);
  iVar12 = fast_expansion_sum_zeroelim(elen,local_13b8,iVar12,local_1438,local_1338);
  auVar8._4_8_ = extraout_XMM0_Qb_01;
  auVar8._0_4_ = uStack_1754;
  auVar22._0_8_ = auVar8._0_8_ << 0x20;
  auVar22._8_4_ = uVar27;
  auVar22._12_4_ = uVar28;
  iVar12 = scale_expansion_zeroelim(iVar12,local_1338,auVar22._8_8_,local_db8);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,local_f38,iVar10,local_10b8,local_338);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,local_1238,iVar12,local_db8,local_638);
  uVar14 = fast_expansion_sum_zeroelim(iVar9,local_338,iVar10,local_638,local_c38);
  if (1 < (int)uVar14) {
    uVar15 = 1;
    do {
      local_c38[0] = local_c38[0] + local_c38[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  if ((local_c38[0] < isperrboundB * permanent) && (-local_c38[0] < isperrboundB * permanent)) {
    dVar45 = (dVar46 - (dVar29 + (dVar46 - dVar29))) + ((dVar46 - dVar29) - dVar62);
    dVar49 = (dVar48 - (dVar35 + (dVar48 - dVar35))) + ((dVar48 - dVar35) - dVar61);
    dVar52 = (dVar52 - (dVar17 + (dVar52 - dVar17))) + ((dVar52 - dVar17) - dVar62);
    dVar55 = (dVar55 - (dVar25 + (dVar55 - dVar25))) + ((dVar55 - dVar25) - dVar61);
    dVar46 = (dVar73 - (dVar57 + (dVar73 - dVar57))) + ((dVar73 - dVar57) - dVar62);
    dVar48 = (dVar75 - (dVar60 + (dVar75 - dVar60))) + ((dVar75 - dVar60) - dVar61);
    dVar61 = (dVar19 - (dVar51 + (dVar19 - dVar51))) + ((dVar19 - dVar51) - dVar61);
    dVar62 = (dVar78 - (dVar54 + (dVar78 - dVar54))) + ((dVar78 - dVar54) - dVar62);
    dStack_1680 = auVar32._8_8_;
    dVar73 = (dVar68 - (dVar69 + (dVar68 - dVar69))) + ((dVar68 - dVar69) - dVar26);
    dVar75 = (dVar18 - (dVar58 + (dVar18 - dVar58))) + ((dVar18 - dVar58) - dStack_1680);
    dStack_1730 = auVar42._8_8_;
    dStack_1750 = auVar43._8_8_;
    dVar26 = (dVar64 - (dVar38 + (dVar64 - dVar38))) + ((dVar64 - dVar38) - dVar26);
    dVar78 = (dVar66 - (dVar67 + (dVar66 - dVar67))) + ((dVar66 - dVar67) - dStack_1680);
    dVar64 = (aheight - (dVar50 + (aheight - dVar50))) + ((aheight - dVar50) - eheight);
    dVar66 = (bheight - (dVar36 + (bheight - dVar36))) + ((bheight - dVar36) - eheight);
    dVar68 = (cheight - (dVar1 + (cheight - dVar1))) + ((cheight - dVar1) - eheight);
    dVar18 = (dStack_1730 - (dStack_1750 + (dStack_1730 - dStack_1750))) +
             ((dStack_1730 - dStack_1750) - eheight);
    auVar31._8_8_ = -(ulong)(dVar78 != 0.0);
    auVar31._0_8_ = -(ulong)(dVar55 != 0.0);
    auVar40._8_8_ = -(ulong)(dVar48 != 0.0);
    auVar40._0_8_ = -(ulong)(dVar46 != 0.0);
    auVar32 = packssdw(auVar31,auVar40);
    auVar23._8_8_ = -(ulong)(dVar52 != 0.0);
    auVar23._0_8_ = -(ulong)(dVar26 != 0.0);
    auVar41._8_8_ = -(ulong)(dVar49 != 0.0);
    auVar41._0_8_ = -(ulong)(dVar45 != 0.0);
    auVar42 = packssdw(auVar41,auVar23);
    auVar43 = packssdw(auVar42,auVar32);
    auVar33._8_8_ = -(ulong)(dVar75 != 0.0);
    auVar33._0_8_ = -(ulong)(dVar61 != 0.0);
    auVar24._8_8_ = -(ulong)(dVar62 != 0.0);
    auVar24._0_8_ = -(ulong)(dVar73 != 0.0);
    auVar32 = packssdw(auVar24,auVar33);
    auVar34._8_8_ = -(ulong)(dVar66 != 0.0);
    auVar34._0_8_ = -(ulong)(dVar64 != 0.0);
    lVar16 = -(ulong)(dVar18 != 0.0);
    auVar3._8_4_ = (int)lVar16;
    auVar3._0_8_ = -(ulong)(dVar68 != 0.0);
    auVar3._12_4_ = (int)((ulong)lVar16 >> 0x20);
    auVar42 = packssdw(auVar34,auVar3);
    auVar32 = packssdw(auVar32,auVar42);
    auVar32 = packsswb(auVar43,auVar32);
    if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar32[0xf] < '\0')
    {
      dVar58 = permanent * isperrboundC + ABS(local_c38[0]) * resulterrbound;
      dVar19 = (dVar55 * dVar29 + dVar25 * dVar45) - (dVar52 * dVar35 + dVar17 * dVar49);
      dVar63 = (dVar17 * dVar48 + dVar52 * dVar60) - (dVar25 * dVar46 + dVar55 * dVar57);
      dVar70 = (dVar57 * dVar61 + dVar46 * dVar51) - (dVar60 * dVar62 + dVar48 * dVar54);
      dVar53 = (dVar54 * dVar49 + dVar35 * dVar62) - (dVar51 * dVar45 + dVar29 * dVar61);
      dVar46 = (dVar48 * dVar29 + dVar60 * dVar45) - (dVar46 * dVar35 + dVar57 * dVar49);
      dVar62 = (dVar17 * dVar61 + dVar51 * dVar52) - (dVar25 * dVar62 + dVar54 * dVar55);
      local_c38[0] = ((dVar36 * (dVar26 * dVar5 + dVar73 * dVar59 + dVar75 * dVar37 +
                                dVar38 * dVar70 + dVar69 * dVar53 + dVar39 * dVar46) +
                      dStack_1750 *
                      (dVar73 * dVar30 + (dVar26 * dVar4 - dVar37 * dVar78) +
                      dVar69 * dVar19 + dVar38 * dVar63 + dVar46 * dVar56)) -
                     (dVar50 * (dVar75 * dVar4 + (dVar78 * dVar5 - dVar44 * dVar73) +
                               dVar63 * dVar39 + dVar70 * dVar67 + dVar62 * dVar47) +
                     dVar1 * (dVar78 * dVar59 + dVar75 * dVar30 + dVar26 * dVar44 +
                             dVar53 * dVar67 + dVar19 * dVar39 + dVar38 * dVar62))) +
                     ((dVar66 * (dVar38 * dVar5 + dVar69 * dVar59 + dVar39 * dVar37) +
                      dVar18 * (dVar69 * dVar30 + dVar38 * dVar4 + dVar37 * dVar56)) -
                     (dVar64 * (dVar4 * dVar39 + dVar5 * dVar67 + dVar47 * dVar44) +
                     dVar68 * (dVar59 * dVar67 + dVar39 * dVar30 + dVar44 * dVar38))) + local_c38[0]
      ;
      if ((local_c38[0] < dVar58) && (-local_c38[0] < dVar58)) {
        dVar64 = orient4dexact(pa,pb,pc,pd,pe,aheight,bheight,cheight,dheight,eheight);
        return dVar64;
      }
    }
  }
  return local_c38[0];
}

Assistant:

REAL orient4dadapt(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe,
                   REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
                   REAL eheight, REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  INEXACT REAL aeheight, beheight, ceheight, deheight;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len;
  REAL adet[48], bdet[48], cdet[48], ddet[48];
  int alen, blen, clen, dlen;
  REAL abdet[96], cddet[96];
  int ablen, cdlen;
  REAL fin1[192];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL aeheighttail, beheighttail, ceheighttail, deheighttail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);
  aeheight = (REAL) (aheight - eheight);
  beheight = (REAL) (bheight - eheight);
  ceheight = (REAL) (cheight - eheight);
  deheight = (REAL) (dheight - eheight);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  alen = scale_expansion_zeroelim(temp24len, temp24, -aeheight, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  blen = scale_expansion_zeroelim(temp24len, temp24, beheight, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  clen = scale_expansion_zeroelim(temp24len, temp24, -ceheight, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  dlen = scale_expansion_zeroelim(temp24len, temp24, deheight, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(aheight, eheight, aeheight, aeheighttail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(bheight, eheight, beheight, beheighttail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(cheight, eheight, ceheight, ceheighttail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  Two_Diff_Tail(dheight, eheight, deheight, deheighttail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)
      && (aeheighttail == 0.0) && (beheighttail == 0.0)
      && (ceheighttail == 0.0) && (deheighttail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += ((beheight
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + deheight
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - (aeheight
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + ceheight
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + ((beheighttail * (cez * da3 + dez * ac3 + aez * cd3)
           + deheighttail * (aez * bc3 - bez * ac3 + cez * ab3))
          - (aeheighttail * (bez * cd3 - cez * bd3 + dez * bc3)
           + ceheighttail * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient4dexact(pa, pb, pc, pd, pe,
                       aheight, bheight, cheight, dheight, eheight);
}